

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

char * stripslashes(char *str,_Bool local)

{
  char *pcVar1;
  char *p;
  char *pcStack_10;
  _Bool local_local;
  char *str_local;
  
  pcVar1 = strrchr(str,0x2f);
  pcStack_10 = str;
  if (pcVar1 != (char *)0x0) {
    pcStack_10 = pcVar1 + 1;
  }
  return pcStack_10;
}

Assistant:

char *stripslashes(const char *str, bool local)
{
    char *p;

    /*
     * On Unix, we do the same thing regardless of the 'local'
     * parameter.
     */
    p = strrchr(str, '/');
    if (p) str = p+1;

    return (char *)str;
}